

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pi-seq.c
# Opt level: O2

int main(int argc,char **argv)

{
  long lVar1;
  uint uVar2;
  long lVar3;
  long lVar4;
  bool bVar5;
  double dVar6;
  undefined1 auVar7 [16];
  double dVar8;
  double dVar9;
  
  if (1 < argc) {
    lVar1 = atol(argv[1]);
    uVar2 = 0x12d591;
    lVar4 = 0;
    dVar6 = wctime();
    lVar3 = lVar1;
    while (bVar5 = lVar3 != 0, lVar3 = lVar3 + -1, bVar5) {
      dVar8 = (double)((uVar2 * 0x41c64e6d + 0x3039) % 0x7fffffff) / 2147483647.0;
      uVar2 = uVar2 * -0x3d5d6597 + 0xd3dc167e;
      dVar9 = (double)(uVar2 % 0x7fffffff) / 2147483647.0;
      lVar4 = lVar4 + (ulong)(SQRT(dVar8 * dVar8 + dVar9 * dVar9) < 1.0);
    }
    auVar7._8_4_ = (int)((ulong)lVar4 >> 0x20);
    auVar7._0_8_ = lVar4;
    auVar7._12_4_ = 0x45300000;
    dVar9 = (((auVar7._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)lVar4) - 4503599627370496.0)) * 4.0) / (double)lVar1;
    dVar8 = wctime();
    printf("pi(%ld) = %.12lf (accuracy: %.12lf)\n",dVar9,
           ABS(3.141592653589793 - dVar9) / 3.141592653589793,lVar1);
    printf("Time: %f\n",dVar8 - dVar6);
    return 0;
  }
  usage(*argv);
  exit(1);
}

Assistant:

int main(int argc, char **argv)
{
    if (argc <= 1) {
        usage(argv[0]);
        exit(1);
    }

    const long n = atol(argv[1]);

    double x, y;
    uint64_t count = 0;
    unsigned int seed = 1234321;
    long m = n;

    double t1 = wctime();
    while (m--) {
        x = rng(&seed, RAND_MAX)/(double)RAND_MAX;
        y = rng(&seed, RAND_MAX)/(double)RAND_MAX;
        if (sqrt(x*x+y*y) < 1.0) ++count;
    }
    double pi = 4.0*(double)count/n;
    double t2 = wctime();

    printf("pi(%ld) = %.12lf (accuracy: %.12lf)\n", n, pi, fabs(M_PI-pi)/M_PI);
    printf("Time: %f\n", t2-t1);

    return 0;
}